

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O1

void PDHG_Check_Data(CUPDLPwork *work)

{
  double dVar1;
  double dVar2;
  CUPDLPproblem *pCVar3;
  CUPDLPdata *pCVar4;
  cupdlp_int *pcVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  
  pCVar3 = work->problem;
  pCVar4 = pCVar3->data;
  iVar6 = pCVar4->nCols;
  uVar7 = 0;
  local_68 = 0;
  uVar11 = 0;
  uVar8 = 0;
  local_60 = 0;
  local_5c = 0;
  if (0 < iVar6) {
    uVar10 = 0;
    local_5c = 0;
    local_60 = 0;
    uVar8 = 0;
    uVar11 = 0;
    local_68 = 0;
    do {
      dVar1 = pCVar3->lower[uVar10];
      dVar2 = pCVar3->upper[uVar10];
      if (((dVar1 == -INFINITY) && (dVar2 == INFINITY)) &&
         (local_5c = local_5c + 1, 0 < work->settings->nLogLevel)) {
        printf("Warning: variable %d is free.",uVar10 & 0xffffffff);
      }
      if ((dVar1 != -INFINITY) && (dVar2 != INFINITY)) {
        if ((pCVar3->lower[uVar10] != pCVar3->upper[uVar10]) ||
           (NAN(pCVar3->lower[uVar10]) || NAN(pCVar3->upper[uVar10]))) {
          local_68 = local_68 + 1;
        }
        else {
          local_60 = local_60 + 1;
        }
      }
      uVar11 = uVar11 + (dVar1 != -INFINITY && dVar2 == INFINITY);
      uVar8 = uVar8 + (dVar1 == -INFINITY && dVar2 != INFINITY);
      uVar10 = uVar10 + 1;
      iVar6 = pCVar4->nCols;
    } while ((long)uVar10 < (long)iVar6);
  }
  uVar10 = (ulong)(uint)pCVar4->nCols;
  uVar9 = 0;
  local_6c = 0;
  local_64 = 0;
  local_58 = 0;
  if (iVar6 < pCVar4->nCols) {
    lVar12 = (long)iVar6;
    local_58 = 0;
    local_64 = 0;
    local_6c = 0;
    uVar9 = 0;
    uVar7 = 0;
    do {
      dVar1 = pCVar3->lower[lVar12];
      dVar2 = pCVar3->upper[lVar12];
      if ((dVar1 == -INFINITY) && (dVar2 == INFINITY)) {
        local_58 = local_58 + 1;
        if (0 < work->settings->nLogLevel) {
          printf("Warning: row %d is free.",(ulong)(uint)((int)lVar12 - (int)uVar10));
        }
      }
      if ((dVar1 != -INFINITY) && (dVar2 != INFINITY)) {
        if ((pCVar3->lower[lVar12] != pCVar3->upper[lVar12]) ||
           (NAN(pCVar3->lower[lVar12]) || NAN(pCVar3->upper[lVar12]))) {
          local_6c = local_6c + 1;
        }
        else {
          local_64 = local_64 + 1;
        }
      }
      uVar9 = uVar9 + (dVar1 != -INFINITY && dVar2 == INFINITY);
      uVar7 = uVar7 + (dVar1 == -INFINITY && dVar2 != INFINITY);
      lVar12 = lVar12 + 1;
      uVar10 = (ulong)pCVar4->nCols;
    } while (lVar12 < (long)uVar10);
  }
  if (0 < pCVar4->nRows) {
    uVar10 = 0;
    do {
      pcVar5 = pCVar3->data->csr_matrix->rowMatBeg;
      if ((pcVar5[uVar10 + 1] - pcVar5[uVar10] == 1) && (0 < work->settings->nLogLevel)) {
        printf("Warning: row %d is a singleton row.",uVar10 & 0xffffffff);
      }
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)pCVar4->nRows);
  }
  if (0 < work->settings->nLogLevel) {
    printf("nFreeCol  : %d\n",(ulong)local_5c);
    printf("nFixedCol : %d\n",(ulong)local_60);
    printf("nRangedCol: %d\n",(ulong)local_68);
    printf("nLowerCol : %d\n",(ulong)uVar11);
    printf("nUpperCol : %d\n",(ulong)uVar8);
    printf("nFreeRow  : %d\n",(ulong)local_58);
    printf("nFixedRow : %d\n",(ulong)local_64);
    printf("nRangedRow: %d\n",(ulong)local_6c);
    printf("nLowerRow : %d\n",(ulong)uVar9);
    printf("nUpperRow : %d\n",(ulong)uVar7);
    return;
  }
  return;
}

Assistant:

void PDHG_Check_Data(CUPDLPwork *work) {
  CUPDLPproblem *problem = work->problem;
  CUPDLPdata *lp = problem->data;
  CUPDLPstepsize *stepsize = work->stepsize;
  CUPDLPiterates *iterates = work->iterates;
  cupdlp_int nFreeCol = 0;
  cupdlp_int nFixedCol = 0;
  cupdlp_int nUpperCol = 0;
  cupdlp_int nLowerCol = 0;
  cupdlp_int nRangedCol = 0;
  cupdlp_int nFreeRow = 0;
  cupdlp_int nFixedRow = 0;
  cupdlp_int nUpperRow = 0;
  cupdlp_int nLowerRow = 0;
  cupdlp_int nRangedRow = 0;


  cupdlp_int iter = work->timers->nIter;
  CUPDLPvec *x = iterates->x[iter % 2];
  CUPDLPvec *y = iterates->y[iter % 2];

  for (cupdlp_int iSeq = 0; iSeq < lp->nCols; ++iSeq) {
    cupdlp_bool hasLower = problem->lower[iSeq] > -INFINITY;
    cupdlp_bool hasUpper = problem->upper[iSeq] < +INFINITY;

    if (!hasLower && !hasUpper) {
      ++nFreeCol;
      if (work->settings->nLogLevel>0) 
	cupdlp_printf("Warning: variable %d is free.", iSeq);
    }

    if (hasLower && hasUpper) {
      if (problem->lower[iSeq] == problem->upper[iSeq]) {
        ++nFixedCol;
        // cupdlp_printf( "Warning: variable %d is fixed.", iSeq);
      } else
        ++nRangedCol;
    }

    if (hasLower) {
      // XXX: uncommented for PDLP comparison
      // CUPDLP_ASSERT(x[iSeq] >= problem->lower[iSeq]);
      nLowerCol += !hasUpper;
    }

    if (hasUpper) {
      // XXX: uncommented for PDLP comparison
      // CUPDLP_ASSERT(x[iSeq] <= problem->upper[iSeq]);
      nUpperCol += !hasLower;
    }
  }

  for (cupdlp_int iSeq = lp->nCols; iSeq < lp->nCols; ++iSeq) {
    cupdlp_bool hasLower = problem->lower[iSeq] > -INFINITY;
    cupdlp_bool hasUpper = problem->upper[iSeq] < +INFINITY;

    if (!hasLower && !hasUpper) {
      ++nFreeRow;
      if (work->settings->nLogLevel>0) 
	cupdlp_printf("Warning: row %d is free.", iSeq - lp->nCols);
    }

    if (hasLower && hasUpper) {
      if (problem->lower[iSeq] == problem->upper[iSeq])
        ++nFixedRow;
      else
        ++nRangedRow;
    }

    if (hasLower) {
      // CUPDLP_ASSERT(x[iSeq] >= problem->lower[iSeq]);
      nLowerRow += !hasUpper;
    }

    if (hasUpper) {
      // CUPDLP_ASSERT(x[iSeq] <= problem->upper[iSeq]);
      nUpperRow += !hasLower;
    }
  }

  for (cupdlp_int iRow = 0; iRow < lp->nRows; ++iRow) {
    CUPDLP_ASSERT(y->data[iRow] < +INFINITY);
    CUPDLP_ASSERT(y->data[iRow] > -INFINITY);
  }

  for (cupdlp_int iRow = 0; iRow < lp->nRows; ++iRow) {
    if (problem->data->csr_matrix->rowMatBeg[iRow + 1] -
            problem->data->csr_matrix->rowMatBeg[iRow] ==
        1) {
      if (work->settings->nLogLevel>0) 
	cupdlp_printf("Warning: row %d is a singleton row.", iRow);
    }
  }

  CUPDLP_ASSERT(nRangedRow == 0);
  if (work->settings->nLogLevel>0) {
    cupdlp_printf("nFreeCol  : %d\n", nFreeCol);
    cupdlp_printf("nFixedCol : %d\n", nFixedCol);
    cupdlp_printf("nRangedCol: %d\n", nRangedCol);
    cupdlp_printf("nLowerCol : %d\n", nLowerCol);
    cupdlp_printf("nUpperCol : %d\n", nUpperCol);
    cupdlp_printf("nFreeRow  : %d\n", nFreeRow);
    cupdlp_printf("nFixedRow : %d\n", nFixedRow);
    cupdlp_printf("nRangedRow: %d\n", nRangedRow);
    cupdlp_printf("nLowerRow : %d\n", nLowerRow);
    cupdlp_printf("nUpperRow : %d\n", nUpperRow);
  }

  // We need to test problems ranged row-bounds more carefully.
  CUPDLP_ASSERT(nRangedRow == 0);
}